

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O0

bool Diligent::VerifyTraceRaysIndirectAttribs
               (IRenderDevice *pDevice,TraceRaysIndirectAttribs *Attribs,Uint32 SBTSize)

{
  IShaderBindingTable *pIVar1;
  VERIFY_SBT_FLAGS VVar2;
  uint uVar3;
  BIND_FLAGS BVar4;
  Char *pCVar5;
  char (*Args_1) [39];
  char (*in_RCX) [77];
  char (*in_R9) [53];
  undefined1 local_100 [8];
  string msg_5;
  string msg_4;
  string msg_3;
  BufferDesc *Desc;
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  IBuffer *pAttribsBuffer;
  Uint32 SBTSize_local;
  TraceRaysIndirectAttribs *Attribs_local;
  IRenderDevice *pDevice_local;
  
  msg.field_2._8_8_ = Attribs->pAttribsBuffer;
  if (Attribs->pSBT == (IShaderBindingTable *)0x0) {
    FormatString<char[42],char[22]>
              ((string *)local_48,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])0xe587ba,(char (*) [22])in_RCX);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [77])0x453;
    DebugAssertionFailed
              (pCVar5,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x453);
    std::__cxx11::string::~string((string *)local_48);
  }
  pIVar1 = Attribs->pSBT;
  VVar2 = operator|(VERIFY_SBT_FLAG_SHADER_ONLY,VERIFY_SBT_FLAG_TLAS);
  uVar3 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[8])(pIVar1,(ulong)VVar2);
  if ((uVar3 & 1) == 0) {
    FormatString<char[42],char[77]>
              ((string *)((long)&msg_2.field_2 + 8),
               (Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])
               "not all shaders in SBT are bound or instance to shader mapping is incorrect.",in_RCX
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [77])0x457;
    DebugAssertionFailed
              (pCVar5,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x457);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (msg.field_2._8_8_ == 0) {
    FormatString<char[42],char[53]>
              ((string *)&Desc,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect dispatch arguments buffer must not be null.",
               (char (*) [53])in_RCX);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x45a);
    std::__cxx11::string::~string((string *)&Desc);
  }
  Args_1 = (char (*) [39])(**(code **)(*(long *)msg.field_2._8_8_ + 0x20))();
  BVar4 = operator&(*(BIND_FLAGS *)(*Args_1 + 0x10),BIND_INDIRECT_DRAW_ARGS);
  if (BVar4 == BIND_NONE) {
    FormatString<char[42],char[39],char_const*,char[53]>
              ((string *)((long)&msg_4.field_2 + 8),
               (Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' was not created with BIND_INDIRECT_DRAW_ARGS flag.",in_R9);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x45e);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  BVar4 = operator&(*(BIND_FLAGS *)(*Args_1 + 0x10),BIND_RAY_TRACING);
  if (BVar4 == BIND_NONE) {
    FormatString<char[42],char[39],char_const*,char[46]>
              ((string *)((long)&msg_5.field_2 + 8),
               (Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' was not created with BIND_RAY_TRACING flag.",(char (*) [46])in_R9);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x460);
    std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
  }
  if (*(ulong *)(*Args_1 + 8) < Attribs->ArgsByteOffset + (ulong)SBTSize) {
    FormatString<char[42],char[39],char_const*,char[15]>
              ((string *)local_100,(Diligent *)"Trace rays indirect attribs are invalid: ",
               (char (*) [42])"indirect trace rays arguments buffer \'",Args_1,
               (char **)"\' is too small",(char (*) [15])in_R9);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"VerifyTraceRaysIndirectAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x462);
    std::__cxx11::string::~string((string *)local_100);
  }
  return true;
}

Assistant:

bool VerifyTraceRaysIndirectAttribs(const IRenderDevice* pDevice, const TraceRaysIndirectAttribs& Attribs, Uint32 SBTSize)
{
    const IBuffer* pAttribsBuffer = Attribs.pAttribsBuffer;

#define CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Trace rays indirect attribs are invalid: ", __VA_ARGS__)
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.pSBT != nullptr, "pSBT must not be null");

#ifdef DILIGENT_DEVELOPMENT
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.pSBT->Verify(VERIFY_SBT_FLAG_SHADER_ONLY | VERIFY_SBT_FLAG_TLAS),
                                      "not all shaders in SBT are bound or instance to shader mapping is incorrect.");
#endif // DILIGENT_DEVELOPMENT

    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(pAttribsBuffer != nullptr, "indirect dispatch arguments buffer must not be null.");

    const BufferDesc& Desc = pAttribsBuffer->GetDesc();
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS((Desc.BindFlags & BIND_INDIRECT_DRAW_ARGS) != 0,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' was not created with BIND_INDIRECT_DRAW_ARGS flag.");
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS((Desc.BindFlags & BIND_RAY_TRACING) != 0,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' was not created with BIND_RAY_TRACING flag.");
    CHECK_TRACE_RAYS_INDIRECT_ATTRIBS(Attribs.ArgsByteOffset + SBTSize <= Desc.Size,
                                      "indirect trace rays arguments buffer '", Desc.Name, "' is too small");

#undef CHECK_TRACE_RAYS_INDIRECT_ATTRIBS

    return true;
}